

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  byte bVar11;
  uchar *puVar12;
  stbtt__buf sVar13;
  float fVar14;
  stbtt_uint32 sVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  uint uVar34;
  float fVar35;
  float dy1;
  float fVar36;
  float dy2;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  stbtt__buf sVar41;
  stbtt__buf sVar42;
  stbtt__buf b;
  undefined1 in_stack_fffffffffffffd98 [12];
  int iVar43;
  stbtt__buf local_258;
  float in_stack_fffffffffffffdc0;
  int iVar44;
  ulong uVar45;
  float afStack_1e8 [2];
  stbtt_fontinfo *local_1e0;
  float s [48];
  stbtt__buf subr_stack [10];
  
  sVar41 = info->subrs;
  local_258 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar21 = local_258._8_8_;
  uVar16 = uVar21 >> 0x20;
  if (local_258.size <= local_258.cursor) {
switchD_00131e8e_default:
    return 0;
  }
  uVar29 = glyph_index + 1;
  iVar43 = 1;
  iVar17 = 0;
  uVar45 = 0;
  iVar44 = 0;
  uVar30 = 0;
LAB_00131aab:
  fVar40 = s[10];
  dy2 = s[9];
  fVar14 = s[8];
  dy1 = s[7];
  fVar38 = s[6];
  fVar39 = s[5];
  fVar37 = s[4];
  fVar36 = s[2];
  fVar35 = s[1];
  iVar18 = (int)uVar21;
  uVar21 = (long)iVar18 + 1;
  iVar24 = (int)uVar21;
  local_258.cursor = iVar24;
  bVar11 = local_258.data[iVar18];
  uVar34 = (uint)uVar30;
  iVar32 = (int)uVar16;
  switch(bVar11) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    iVar17 = iVar17 + ((int)((int)(uVar30 >> 0x1f) + uVar34) >> 1);
    break;
  case 2:
  case 9:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_00131adf_caseD_2:
    if (bVar11 < 0x20) {
      return 0;
    }
    if (bVar11 == 0xff) goto LAB_00131bfc;
  case 0x1c:
    if ((iVar18 < 0) || (iVar32 < iVar18)) {
LAB_00132755:
      __assert_fail("!(o > b->size || o < 0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_truetype.h"
                    ,0x478,"void stbtt__buf_seek(stbtt__buf *, int)");
    }
    local_258.cursor = iVar18;
    sVar15 = stbtt__cff_int(&local_258);
    fVar35 = (float)(int)(short)sVar15;
LAB_00131c33:
    if (0x2f < (int)uVar34) {
      return 0;
    }
    s[(int)uVar34] = fVar35;
    uVar31 = (ulong)(uVar34 + 1);
    goto LAB_001321be;
  case 4:
    if ((int)uVar34 < 1) {
      return 0;
    }
    fVar35 = s[uVar34 - 1];
    fVar36 = 0.0;
    goto LAB_0013217d;
  case 5:
    if ((int)uVar34 < 2) {
      return 0;
    }
    uVar16 = 1;
    do {
      uVar2 = c->x;
      uVar7 = c->y;
      fVar35 = (float)uVar2 + (float)*(undefined8 *)(s + (uVar16 - 1));
      fVar36 = (float)uVar7 + (float)((ulong)*(undefined8 *)(s + (uVar16 - 1)) >> 0x20);
      c->x = fVar35;
      c->y = fVar36;
      uVar31 = 0;
      stbtt__csctx_v(c,'\x02',(int)fVar35,(int)fVar36,0,0,0,0);
      uVar16 = uVar16 + 2;
    } while (uVar16 < uVar30);
    goto LAB_001321be;
  case 6:
    iVar32 = 0;
    if ((int)uVar34 < 1) {
      return 0;
    }
    for (; iVar32 < (int)uVar34; iVar32 = iVar32 + 1) {
      uVar4 = c->x;
      uVar9 = c->y;
      fVar35 = s[iVar32];
      c->x = fVar35 + (float)uVar4;
      c->y = (float)uVar9 + 0.0;
      stbtt__csctx_v(c,'\x02',(int)(fVar35 + (float)uVar4),(int)((float)uVar9 + 0.0),0,0,0,0);
      iVar32 = iVar32 + 1;
LAB_001326d1:
      if ((int)uVar34 <= iVar32) break;
      uVar5 = c->x;
      uVar10 = c->y;
      fVar35 = s[iVar32];
      c->x = (float)uVar5 + 0.0;
      c->y = fVar35 + (float)uVar10;
      stbtt__csctx_v(c,'\x02',(int)((float)uVar5 + 0.0),(int)(fVar35 + (float)uVar10),0,0,0,0);
    }
    break;
  case 7:
    iVar32 = 0;
    if (0 < (int)uVar34) goto LAB_001326d1;
    return 0;
  case 8:
    if ((int)uVar34 < 6) {
      return 0;
    }
    uVar16 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,afStack_1e8[uVar16 - 1],afStack_1e8[uVar16],afStack_1e8[uVar16 + 1],s[uVar16 - 2]
                 ,s[uVar16 - 1],s[uVar16]);
      uVar16 = uVar16 + 6;
    } while (uVar16 < uVar30);
    break;
  case 10:
    iVar32 = 1;
    if (iVar44 == 0) {
      uVar19 = (info->fdselect).size;
      if (uVar19 != 0) {
        if ((int)uVar19 < 0) goto LAB_00132755;
        puVar12 = (info->fdselect).data;
        if (*puVar12 == '\0') {
          if (uVar19 < uVar29) goto LAB_00132755;
          uVar23 = 0;
          if (uVar29 < uVar19) {
            uVar23 = (uint)puVar12[uVar29];
          }
        }
        else {
          if (*puVar12 == '\x03') {
            uVar20 = 0;
            iVar24 = 1;
            iVar32 = 2;
            do {
              if (iVar24 < (int)uVar19) {
                lVar28 = (long)iVar24;
                iVar24 = iVar24 + 1;
                uVar23 = (uint)puVar12[lVar28];
              }
              else {
                uVar23 = 0;
              }
              uVar20 = uVar20 << 8 | uVar23;
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
            uVar25 = 0;
            iVar32 = 2;
            do {
              if (iVar24 < (int)uVar19) {
                lVar28 = (long)iVar24;
                iVar24 = iVar24 + 1;
                uVar23 = (uint)puVar12[lVar28];
              }
              else {
                uVar23 = 0;
              }
              uVar25 = uVar25 << 8 | uVar23;
              iVar32 = iVar32 + -1;
            } while (iVar32 != 0);
            if (0 < (int)uVar20) {
              uVar26 = 0;
              do {
                if (iVar24 < (int)uVar19) {
                  lVar28 = (long)iVar24;
                  iVar24 = iVar24 + 1;
                  uVar23 = (uint)puVar12[lVar28];
                }
                else {
                  uVar23 = 0;
                }
                uVar27 = 0;
                iVar32 = 2;
                do {
                  if (iVar24 < (int)uVar19) {
                    lVar28 = (long)iVar24;
                    iVar24 = iVar24 + 1;
                    uVar22 = (uint)puVar12[lVar28];
                  }
                  else {
                    uVar22 = 0;
                  }
                  uVar27 = uVar27 << 8 | uVar22;
                  iVar32 = iVar32 + -1;
                } while (iVar32 != 0);
                local_1e0 = info;
                if (glyph_index < (int)uVar27 && (int)uVar25 <= glyph_index) goto LAB_0013246b;
                uVar26 = uVar26 + 1;
                uVar25 = uVar27;
              } while (uVar26 != uVar20);
            }
          }
          uVar23 = 0xffffffff;
        }
LAB_0013246b:
        stbtt__cff_index_get(info->fontdicts,uVar23);
        sVar41.size = iVar43;
        sVar41.data = (uchar *)in_stack_fffffffffffffd98._0_8_;
        sVar41.cursor = in_stack_fffffffffffffd98._8_4_;
        sVar13.data._4_4_ = iVar44;
        sVar13.data._0_4_ = in_stack_fffffffffffffdc0;
        sVar13.cursor = (int)uVar45;
        sVar13.size = (int)(uVar45 >> 0x20);
        sVar41 = stbtt__get_subrs(sVar41,sVar13);
        iVar32 = 1;
      }
    }
    goto LAB_001324a7;
  case 0xb:
    if ((int)uVar45 < 1) {
      return 0;
    }
    uVar45 = (ulong)((int)uVar45 - 1);
    local_258.data._4_4_ = *(undefined4 *)((long)&subr_stack[uVar45].data + 4);
    local_258.data._0_4_ = *(undefined4 *)&subr_stack[uVar45].data;
    local_258.cursor = subr_stack[uVar45].cursor;
    local_258.size = subr_stack[uVar45].size;
    uVar31 = uVar30;
    goto LAB_001321be;
  case 0xc:
    if (iVar32 <= iVar24) {
      return 0;
    }
    local_258.cursor = iVar18 + 2;
    switch(local_258.data[uVar21]) {
    case '\"':
      if ((int)uVar34 < 7) {
        return 0;
      }
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      dy2 = -fVar36;
      dy1 = 0.0;
      fVar35 = 0.0;
      break;
    case '#':
      if ((int)uVar34 < 0xd) {
        return 0;
      }
      fVar35 = s[0xb];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar37 = fVar38;
      fVar39 = fVar14;
      in_stack_fffffffffffffdc0 = fVar35;
      fVar38 = fVar40;
      break;
    case '$':
      if ((int)uVar34 < 9) {
        return 0;
      }
      in_stack_fffffffffffffdc0 = s[3];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      fVar35 = -(fVar35 + in_stack_fffffffffffffdc0 + dy1);
      fVar37 = fVar39;
      dy2 = dy1;
      fVar39 = fVar38;
      dy1 = 0.0;
      fVar38 = fVar14;
      break;
    case '%':
      if ((int)uVar34 < 0xb) {
        return 0;
      }
      fVar35 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar37 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar39 = ABS(fVar35);
      fVar40 = ABS(fVar37);
      fVar36 = s[10];
      if (fVar39 <= fVar40) {
        fVar36 = -fVar35;
      }
      uVar34 = -(uint)(fVar40 < fVar39);
      fVar35 = (float)(~uVar34 & (uint)s[10] | (uint)-fVar37 & uVar34);
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar37 = fVar38;
      fVar39 = fVar14;
      fVar38 = fVar36;
      break;
    default:
      goto switchD_00131e8e_default;
    }
    goto LAB_00131e43;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (iVar43 != 0) {
      iVar17 = iVar17 + ((int)((int)(uVar30 >> 0x1f) + uVar34) >> 1);
    }
    iVar43 = iVar17 + 0xe;
    if (-1 < iVar17 + 7) {
      iVar43 = iVar17 + 7;
    }
    iVar24 = (iVar43 >> 3) + iVar24;
    if ((iVar24 < 0) || (iVar32 < iVar24)) goto LAB_00132755;
    local_258.cursor = iVar24;
    goto LAB_001321b3;
  case 0x15:
    if ((int)uVar34 < 2) {
      return 0;
    }
    fVar36 = s[uVar34 - 2];
    fVar35 = s[uVar34 - 1];
    goto LAB_0013217d;
  case 0x16:
    if ((int)uVar34 < 1) {
      return 0;
    }
    fVar36 = s[uVar34 - 1];
    fVar35 = 0.0;
LAB_0013217d:
    stbtt__csctx_rmove_to(c,fVar36,fVar35);
LAB_001321b3:
    iVar43 = 0;
    break;
  case 0x18:
    if ((int)uVar34 < 8) {
      return 0;
    }
    lVar28 = -6;
    do {
      lVar33 = lVar28;
      stbtt__csctx_rccurve_to
                (c,s[lVar33 + 6],s[lVar33 + 7],s[lVar33 + 8],s[lVar33 + 9],s[lVar33 + 10],
                 s[lVar33 + 0xb]);
      lVar28 = lVar33 + 6;
    } while (lVar33 + 6 < (long)(uVar30 - 0xd));
    if ((int)uVar34 <= (int)lVar33 + 0xd) {
      return 0;
    }
    uVar3 = c->x;
    uVar8 = c->y;
    fVar35 = (float)uVar3 + (float)*(undefined8 *)(s + lVar33 + 0xc);
    fVar36 = (float)uVar8 + (float)((ulong)*(undefined8 *)(s + lVar33 + 0xc) >> 0x20);
    c->x = fVar35;
    c->y = fVar36;
    stbtt__csctx_v(c,'\x02',(int)fVar35,(int)fVar36,0,0,0,0);
    uVar31 = 0;
    goto LAB_001321be;
  case 0x19:
    if ((int)uVar34 < 8) {
      return 0;
    }
    uVar16 = 2;
    local_1e0 = info;
    do {
      uVar21 = uVar16;
      uVar1 = c->x;
      uVar6 = c->y;
      fVar35 = (float)uVar1 + (float)*(undefined8 *)(s + (uVar21 - 2));
      fVar36 = (float)uVar6 + (float)((ulong)*(undefined8 *)(s + (uVar21 - 2)) >> 0x20);
      c->x = fVar35;
      c->y = fVar36;
      stbtt__csctx_v(c,'\x02',(int)fVar35,(int)fVar36,0,0,0,0);
      uVar16 = uVar21 + 2;
    } while (uVar21 + 1 < (ulong)(uVar34 - 6));
    if ((int)uVar34 <= (int)(uVar21 + 5)) {
      return 0;
    }
    fVar35 = s[uVar21 + 5 & 0xffffffff];
    info = local_1e0;
    fVar37 = s[uVar21];
    dy2 = s[(int)uVar16 + 1];
    fVar39 = s[uVar16 & 0xffffffff];
    dy1 = s[uVar21 + 1];
    fVar38 = s[(int)uVar16 + 2];
LAB_00131e43:
    stbtt__csctx_rccurve_to(c,fVar37,dy1,fVar39,dy2,fVar38,fVar35);
    break;
  case 0x1a:
  case 0x1b:
    if ((int)uVar34 < 4) {
      return 0;
    }
    uVar16 = (ulong)(uVar34 & 1);
    if ((uVar34 & 1) + 3 < uVar34) {
      fVar35 = 0.0;
      if ((uVar30 & 1) != 0) {
        fVar35 = s[0];
      }
      do {
        iVar32 = (int)uVar16;
        fVar36 = s[uVar16];
        if (bVar11 == 0x1b) {
          fVar39 = fVar36;
          fVar38 = 0.0;
          fVar37 = s[iVar32 + 3];
          fVar36 = fVar35;
        }
        else {
          fVar37 = 0.0;
          fVar39 = fVar35;
          fVar38 = s[iVar32 + 3];
        }
        stbtt__csctx_rccurve_to(c,fVar39,fVar36,s[uVar16 + 1],s[uVar16 + 2],fVar37,fVar38);
        uVar16 = uVar16 + 4;
        fVar35 = 0.0;
      } while (iVar32 + 7 < (int)uVar34);
    }
    break;
  case 0x1d:
    iVar32 = iVar44;
LAB_001324a7:
    if ((int)uVar34 < 1) {
      return 0;
    }
    iVar44 = (int)uVar45;
    if (9 < iVar44) {
      return 0;
    }
    fVar35 = s[uVar34 - 1];
    *(undefined4 *)&subr_stack[iVar44].data = local_258.data._0_4_;
    *(undefined4 *)((long)&subr_stack[iVar44].data + 4) = local_258.data._4_4_;
    subr_stack[iVar44].cursor = local_258.cursor;
    subr_stack[iVar44].size = local_258.size;
    sVar13 = sVar41;
    if (bVar11 != 10) {
      sVar13 = info->gsubrs;
    }
    b.data = sVar13.data;
    if ((long)sVar13._8_8_ < 0) goto LAB_00132755;
    uVar45 = (ulong)(iVar44 + 1);
    uVar23 = 0;
    iVar44 = 2;
    uVar19 = 0;
    do {
      if ((int)uVar23 < sVar13.size) {
        lVar28 = (long)(int)uVar23;
        uVar23 = uVar23 + 1;
        uVar20 = (uint)b.data[lVar28];
      }
      else {
        uVar20 = 0;
      }
      uVar19 = uVar19 << 8 | uVar20;
      iVar44 = iVar44 + -1;
    } while (iVar44 != 0);
    uVar20 = (uint)(0x4d7 < (int)uVar19) << 10 | 0x6b;
    if (0x846b < (int)uVar19) {
      uVar20 = 0x8000;
    }
    iVar44 = uVar20 + (int)fVar35;
    sVar42 = (stbtt__buf)ZEXT816(0);
    if (iVar44 < (int)uVar19 && -1 < iVar44) {
      b._8_8_ = (ulong)uVar23 | sVar13._8_8_ & 0x7fffffff00000000;
      sVar42 = stbtt__cff_index_get(b,iVar44);
    }
    if (sVar42._8_8_ >> 0x20 == 0) {
      return 0;
    }
    local_258.size = sVar42.size;
    local_258.data = sVar42.data;
    local_258.cursor = 0;
    uVar31 = (ulong)(uVar34 - 1);
    iVar44 = iVar32;
    goto LAB_001321be;
  case 0x1e:
    iVar24 = 0;
    if ((int)uVar34 < 4) {
      return 0;
    }
    while (iVar24 + 3 < (int)uVar34) {
      iVar32 = iVar24 + 4;
      fVar35 = 0.0;
      if (uVar34 - iVar24 == 5) {
        fVar35 = s[iVar32];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar24],s[(long)iVar24 + 1],s[(long)iVar24 + 2],s[iVar24 + 3],fVar35);
LAB_00132622:
      if ((int)uVar34 <= iVar32 + 3) break;
      iVar24 = iVar32 + 4;
      fVar35 = 0.0;
      if (uVar34 - iVar32 == 5) {
        fVar35 = s[iVar24];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar32],0.0,s[(long)iVar32 + 1],s[(long)iVar32 + 2],fVar35,s[iVar32 + 3]);
    }
    break;
  case 0x1f:
    iVar32 = 0;
    if (3 < (int)uVar34) goto LAB_00132622;
    return 0;
  default:
    if (bVar11 != 0xff) goto switchD_00131adf_caseD_2;
LAB_00131bfc:
    uVar19 = 0;
    iVar24 = 4;
    do {
      iVar18 = (int)uVar21;
      if (iVar18 < iVar32) {
        uVar21 = (ulong)(iVar18 + 1);
        uVar23 = (uint)local_258.data[iVar18];
      }
      else {
        uVar23 = 0;
      }
      uVar19 = uVar19 << 8 | uVar23;
      iVar24 = iVar24 + -1;
    } while (iVar24 != 0);
    local_258.cursor = (int)uVar21;
    fVar35 = (float)(int)uVar19 * 1.5258789e-05;
    goto LAB_00131c33;
  }
  uVar31 = 0;
LAB_001321be:
  uVar21 = (ulong)(uint)local_258.cursor;
  uVar16 = (ulong)(uint)local_258.size;
  uVar30 = uVar31;
  if (local_258.size <= local_258.cursor) {
    return 0;
  }
  goto LAB_00131aab;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254))
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}